

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall btSoftBody::updateClusters(btSoftBody *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  uint uVar13;
  Cluster *cluster;
  btVector3 *pbVar14;
  long lVar15;
  float *pfVar16;
  Node **ppNVar17;
  Node *pNVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar22;
  long lVar23;
  btDbvtNode *pbVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  btScalar bVar29;
  btScalar bVar30;
  btScalar bVar32;
  btScalar bVar33;
  undefined1 auVar31 [16];
  btScalar bVar34;
  btScalar bVar35;
  float fVar36;
  float fVar37;
  btScalar bVar38;
  btScalar bVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  btVector3 bVar52;
  btDbvtVolume bounds;
  btMatrix3x3 r;
  btMatrix3x3 s;
  btMatrix3x3 local_168;
  btDbvt *local_130;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  btDbvtVolume local_c8;
  btVector3 local_a0;
  btMatrix3x3 local_90;
  btMatrix3x3 local_60;
  
  CProfileManager::Start_Profile("UpdateClusters");
  if (0 < (this->m_clusters).m_size) {
    local_130 = &this->m_cdbvt;
    lVar26 = 0;
    do {
      cluster = (this->m_clusters).m_data[lVar26];
      uVar13 = (cluster->m_nodes).m_size;
      uVar28 = (ulong)uVar13;
      if (uVar28 != 0) {
        local_168.m_el[0].m_floats[2] = 0.0;
        local_168.m_el[0].m_floats[3] = 0.0;
        local_168.m_el[1].m_floats[2] = 0.0;
        local_168.m_el[1].m_floats[3] = 0.0;
        local_168.m_el[2].m_floats[0] = 0.0;
        local_168.m_el[2].m_floats[1] = 0.0;
        local_168.m_el[0].m_floats[0] = 0.0001;
        local_168.m_el[0].m_floats[1] = 0.0;
        local_168.m_el[1].m_floats[0] = 0.0;
        local_168.m_el[1].m_floats[1] = 0.0002;
        local_168.m_el[2].m_floats[2] = 0.00029999999;
        local_168.m_el[2].m_floats[3] = 0.0;
        bVar52 = clusterCom(cluster);
        *&(cluster->m_com).m_floats = bVar52.m_floats;
        lVar23 = (long)(cluster->m_nodes).m_size;
        if (0 < lVar23) {
          pbVar14 = (cluster->m_framerefs).m_data;
          fVar36 = local_168.m_el[0].m_floats[0];
          fVar37 = local_168.m_el[0].m_floats[1];
          lVar27 = 0;
          bVar29 = local_168.m_el[2].m_floats[2];
          bVar38 = local_168.m_el[0].m_floats[2];
          bVar39 = local_168.m_el[1].m_floats[2];
          do {
            lVar15 = *(long *)((long)(cluster->m_nodes).m_data + lVar27);
            fVar46 = *(float *)(lVar15 + 0x10) - (cluster->m_com).m_floats[0];
            fVar42 = *(float *)(lVar15 + 0x14) - (cluster->m_com).m_floats[1];
            fVar40 = *(float *)(lVar15 + 0x18) - (cluster->m_com).m_floats[2];
            bVar38 = bVar38 + *(float *)((long)pbVar14->m_floats + lVar27 * 2 + 8) * fVar46;
            uVar11 = *(undefined8 *)((long)pbVar14->m_floats + lVar27 * 2);
            fVar36 = fVar36 + fVar46 * (float)uVar11;
            fVar37 = fVar37 + fVar46 * (float)((ulong)uVar11 >> 0x20);
            local_168.m_el[0].m_floats[1] = fVar37;
            local_168.m_el[0].m_floats[0] = fVar36;
            local_168.m_el[0].m_floats[2] = bVar38;
            bVar39 = bVar39 + *(float *)((long)pbVar14->m_floats + lVar27 * 2 + 8) * fVar42;
            uVar11 = *(undefined8 *)((long)pbVar14->m_floats + lVar27 * 2);
            local_168.m_el[1].m_floats[0] = local_168.m_el[1].m_floats[0] + fVar42 * (float)uVar11;
            local_168.m_el[1].m_floats[1] =
                 local_168.m_el[1].m_floats[1] + fVar42 * (float)((ulong)uVar11 >> 0x20);
            local_168.m_el[1].m_floats[2] = bVar39;
            bVar29 = bVar29 + *(float *)((long)pbVar14->m_floats + lVar27 * 2 + 8) * fVar40;
            uVar11 = *(undefined8 *)((long)pbVar14->m_floats + lVar27 * 2);
            local_168.m_el[2].m_floats[0] = local_168.m_el[2].m_floats[0] + fVar40 * (float)uVar11;
            local_168.m_el[2].m_floats[1] =
                 local_168.m_el[2].m_floats[1] + fVar40 * (float)((ulong)uVar11 >> 0x20);
            local_168.m_el[2].m_floats[2] = bVar29;
            lVar27 = lVar27 + 8;
          } while (lVar23 * 8 != lVar27);
        }
        if ((PolarDecompose(btMatrix3x3_const&,btMatrix3x3&,btMatrix3x3&)::polar == '\0') &&
           (iVar22 = __cxa_guard_acquire(&PolarDecompose(btMatrix3x3_const&,btMatrix3x3&,btMatrix3x3&)
                                          ::polar), iVar22 != 0)) {
          btPolarDecomposition::btPolarDecomposition
                    ((btPolarDecomposition *)
                     &PolarDecompose(btMatrix3x3_const&,btMatrix3x3&,btMatrix3x3&)::polar,0.0001,
                     0x10);
          __cxa_guard_release(&PolarDecompose(btMatrix3x3_const&,btMatrix3x3&,btMatrix3x3&)::polar);
        }
        btPolarDecomposition::decompose
                  ((btPolarDecomposition *)
                   &PolarDecompose(btMatrix3x3_const&,btMatrix3x3&,btMatrix3x3&)::polar,&local_168,
                   &local_90,&local_60);
        uVar11 = *(undefined8 *)((cluster->m_com).m_floats + 2);
        *(undefined8 *)(cluster->m_framexform).m_origin.m_floats =
             *(undefined8 *)(cluster->m_com).m_floats;
        *(undefined8 *)((cluster->m_framexform).m_origin.m_floats + 2) = uVar11;
        *(undefined8 *)(cluster->m_framexform).m_basis.m_el[0].m_floats =
             local_90.m_el[0].m_floats._0_8_;
        *(undefined8 *)((cluster->m_framexform).m_basis.m_el[0].m_floats + 2) =
             local_90.m_el[0].m_floats._8_8_;
        *(undefined8 *)(cluster->m_framexform).m_basis.m_el[1].m_floats =
             local_90.m_el[1].m_floats._0_8_;
        *(undefined8 *)((cluster->m_framexform).m_basis.m_el[1].m_floats + 2) =
             local_90.m_el[1].m_floats._8_8_;
        *(undefined8 *)(cluster->m_framexform).m_basis.m_el[2].m_floats =
             local_90.m_el[2].m_floats._0_8_;
        *(undefined8 *)((cluster->m_framexform).m_basis.m_el[2].m_floats + 2) =
             local_90.m_el[2].m_floats._8_8_;
        fVar36 = (cluster->m_locii).m_el[1].m_floats[0];
        fVar37 = (cluster->m_framexform).m_basis.m_el[0].m_floats[0];
        fVar40 = (cluster->m_framexform).m_basis.m_el[0].m_floats[1];
        fVar42 = (cluster->m_locii).m_el[0].m_floats[0];
        fVar46 = (cluster->m_locii).m_el[0].m_floats[1];
        fVar50 = (cluster->m_locii).m_el[2].m_floats[0];
        fVar44 = (cluster->m_framexform).m_basis.m_el[0].m_floats[2];
        local_d8 = ZEXT416((uint)fVar44);
        fVar41 = fVar50 * fVar44 + fVar42 * fVar37 + fVar36 * fVar40;
        fVar45 = (cluster->m_locii).m_el[1].m_floats[1];
        local_f8 = ZEXT416((uint)fVar40);
        local_e8 = ZEXT416((uint)fVar37);
        fVar1 = (cluster->m_locii).m_el[2].m_floats[1];
        local_128 = ZEXT416((uint)fVar1);
        fVar43 = fVar1 * fVar44 + fVar46 * fVar37 + fVar40 * fVar45;
        fVar2 = (cluster->m_locii).m_el[0].m_floats[2];
        fVar3 = (cluster->m_locii).m_el[1].m_floats[2];
        fVar4 = (cluster->m_locii).m_el[2].m_floats[2];
        fVar48 = fVar4 * fVar44 + fVar2 * fVar37 + fVar40 * fVar3;
        fVar5 = (cluster->m_framexform).m_basis.m_el[1].m_floats[1];
        fVar6 = (cluster->m_framexform).m_basis.m_el[1].m_floats[0];
        fVar7 = (cluster->m_framexform).m_basis.m_el[1].m_floats[2];
        local_108 = ZEXT416((uint)fVar7);
        fVar47 = fVar50 * fVar7 + fVar42 * fVar6 + fVar36 * fVar5;
        local_118 = ZEXT416((uint)fVar5);
        fVar51 = fVar1 * fVar7 + fVar46 * fVar6 + fVar45 * fVar5;
        fVar49 = fVar4 * fVar7 + fVar2 * fVar6 + fVar3 * fVar5;
        fVar8 = (cluster->m_framexform).m_basis.m_el[2].m_floats[1];
        fVar9 = (cluster->m_framexform).m_basis.m_el[2].m_floats[0];
        fVar10 = (cluster->m_framexform).m_basis.m_el[2].m_floats[2];
        fVar50 = fVar50 * fVar10 + fVar42 * fVar9 + fVar36 * fVar8;
        fVar36 = fVar1 * fVar10 + fVar46 * fVar9 + fVar45 * fVar8;
        fVar42 = fVar4 * fVar10 + fVar2 * fVar9 + fVar3 * fVar8;
        *(ulong *)(cluster->m_invwi).m_el[0].m_floats =
             CONCAT44(fVar48 * fVar7 + fVar41 * fVar6 + fVar43 * fVar5,
                      fVar48 * fVar44 + fVar41 * fVar37 + fVar43 * fVar40);
        (cluster->m_invwi).m_el[0].m_floats[2] = fVar10 * fVar48 + fVar9 * fVar41 + fVar43 * fVar8;
        (cluster->m_invwi).m_el[0].m_floats[3] = 0.0;
        *(ulong *)(cluster->m_invwi).m_el[1].m_floats =
             CONCAT44(fVar49 * fVar7 + fVar47 * fVar6 + fVar51 * fVar5,
                      fVar49 * fVar44 + fVar47 * fVar37 + fVar51 * fVar40);
        (cluster->m_invwi).m_el[1].m_floats[2] = fVar10 * fVar49 + fVar9 * fVar47 + fVar8 * fVar51;
        (cluster->m_invwi).m_el[1].m_floats[3] = 0.0;
        *(ulong *)(cluster->m_invwi).m_el[2].m_floats =
             CONCAT44(fVar42 * fVar7 + fVar50 * fVar6 + fVar36 * fVar5,
                      fVar42 * fVar44 + fVar50 * fVar37 + fVar36 * fVar40);
        (cluster->m_invwi).m_el[2].m_floats[2] = fVar10 * fVar42 + fVar9 * fVar50 + fVar8 * fVar36;
        (cluster->m_invwi).m_el[2].m_floats[3] = 0.0;
        (cluster->m_lv).m_floats[0] = 0.0;
        (cluster->m_lv).m_floats[1] = 0.0;
        (cluster->m_lv).m_floats[2] = 0.0;
        (cluster->m_lv).m_floats[3] = 0.0;
        (cluster->m_av).m_floats[0] = 0.0;
        (cluster->m_av).m_floats[1] = 0.0;
        (cluster->m_av).m_floats[2] = 0.0;
        (cluster->m_av).m_floats[3] = 0.0;
        if (0 < (int)uVar13) {
          pfVar16 = (cluster->m_masses).m_data;
          ppNVar17 = (cluster->m_nodes).m_data;
          uVar11 = *(undefined8 *)(cluster->m_lv).m_floats;
          fVar36 = (float)uVar11;
          fVar37 = (float)((ulong)uVar11 >> 0x20);
          bVar29 = (cluster->m_lv).m_floats[2];
          bVar39 = (cluster->m_av).m_floats[0];
          bVar35 = (cluster->m_av).m_floats[1];
          bVar38 = (cluster->m_av).m_floats[2];
          uVar25 = 0;
          do {
            pNVar18 = ppNVar17[uVar25];
            fVar40 = pfVar16[uVar25];
            fVar42 = (pNVar18->m_v).m_floats[2] * fVar40;
            uVar11 = *(undefined8 *)(pNVar18->m_v).m_floats;
            fVar46 = fVar40 * (float)uVar11;
            fVar40 = fVar40 * (float)((ulong)uVar11 >> 0x20);
            fVar36 = fVar36 + fVar46;
            fVar37 = fVar37 + fVar40;
            *(ulong *)(cluster->m_lv).m_floats = CONCAT44(fVar37,fVar36);
            bVar29 = bVar29 + fVar42;
            (cluster->m_lv).m_floats[2] = bVar29;
            fVar50 = (pNVar18->m_x).m_floats[0] - (cluster->m_com).m_floats[0];
            uVar11 = *(undefined8 *)((pNVar18->m_x).m_floats + 1);
            uVar12 = *(undefined8 *)((cluster->m_com).m_floats + 1);
            fVar44 = (float)uVar11 - (float)uVar12;
            fVar45 = (float)((ulong)uVar11 >> 0x20) - (float)((ulong)uVar12 >> 0x20);
            bVar39 = bVar39 + (fVar42 * fVar44 - fVar40 * fVar45);
            bVar35 = bVar35 + (fVar46 * fVar45 - fVar42 * fVar50);
            bVar38 = bVar38 + (fVar40 * fVar50 - fVar44 * fVar46);
            (cluster->m_av).m_floats[0] = bVar39;
            (cluster->m_av).m_floats[1] = bVar35;
            (cluster->m_av).m_floats[2] = bVar38;
            uVar25 = uVar25 + 1;
          } while (uVar28 != uVar25);
        }
        fVar36 = cluster->m_imass;
        fVar37 = (cluster->m_lv).m_floats[2];
        fVar40 = 1.0 - cluster->m_ldamping;
        *(ulong *)(cluster->m_lv).m_floats =
             CONCAT44(fVar40 * (cluster->m_lv).m_floats[1] * fVar36,
                      fVar40 * fVar36 * (cluster->m_lv).m_floats[0]);
        *(ulong *)((cluster->m_lv).m_floats + 2) = (ulong)(uint)(fVar37 * fVar36 * fVar40);
        fVar36 = (cluster->m_av).m_floats[0];
        fVar37 = (cluster->m_av).m_floats[1];
        fVar40 = (cluster->m_av).m_floats[2];
        fVar42 = 1.0 - cluster->m_adamping;
        auVar31._0_4_ =
             fVar42 * (fVar40 * (cluster->m_invwi).m_el[0].m_floats[2] +
                      fVar36 * (cluster->m_invwi).m_el[0].m_floats[0] +
                      fVar37 * (cluster->m_invwi).m_el[0].m_floats[1]);
        auVar31._4_4_ =
             fVar42 * (fVar40 * (cluster->m_invwi).m_el[1].m_floats[2] +
                      fVar36 * (cluster->m_invwi).m_el[1].m_floats[0] +
                      (cluster->m_invwi).m_el[1].m_floats[1] * fVar37);
        auVar31._8_4_ =
             fVar42 * ((cluster->m_invwi).m_el[2].m_floats[2] * fVar40 +
                      (cluster->m_invwi).m_el[2].m_floats[0] * fVar36 +
                      (cluster->m_invwi).m_el[2].m_floats[1] * fVar37);
        auVar31._12_4_ = 0;
        *(undefined1 (*) [16])(cluster->m_av).m_floats = auVar31;
        cluster->m_vimpulses[0].m_floats[0] = 0.0;
        cluster->m_vimpulses[0].m_floats[1] = 0.0;
        cluster->m_vimpulses[0].m_floats[2] = 0.0;
        cluster->m_vimpulses[0].m_floats[3] = 0.0;
        cluster->m_vimpulses[1].m_floats[0] = 0.0;
        cluster->m_vimpulses[1].m_floats[1] = 0.0;
        cluster->m_vimpulses[1].m_floats[2] = 0.0;
        cluster->m_vimpulses[1].m_floats[3] = 0.0;
        cluster->m_dimpulses[0].m_floats[0] = 0.0;
        cluster->m_dimpulses[0].m_floats[1] = 0.0;
        cluster->m_dimpulses[0].m_floats[2] = 0.0;
        cluster->m_dimpulses[0].m_floats[3] = 0.0;
        cluster->m_dimpulses[1].m_floats[0] = 0.0;
        cluster->m_dimpulses[1].m_floats[1] = 0.0;
        cluster->m_dimpulses[1].m_floats[2] = 0.0;
        cluster->m_dimpulses[1].m_floats[3] = 0.0;
        cluster->m_nvimpulses = 0;
        cluster->m_ndimpulses = 0;
        if ((0.0 < cluster->m_matching) && (0 < (cluster->m_nodes).m_size)) {
          lVar23 = 8;
          lVar27 = 0;
          do {
            pbVar14 = (cluster->m_framerefs).m_data;
            pNVar18 = (cluster->m_nodes).m_data[lVar27];
            fVar36 = *(float *)((long)pbVar14->m_floats + lVar23 + -8);
            fVar37 = *(float *)((long)pbVar14->m_floats + lVar23 + -4);
            fVar40 = *(float *)((long)pbVar14->m_floats + lVar23);
            fVar42 = cluster->m_matching;
            fVar46 = (pNVar18->m_x).m_floats[2];
            uVar11 = *(undefined8 *)(cluster->m_framexform).m_origin.m_floats;
            uVar12 = *(undefined8 *)(pNVar18->m_x).m_floats;
            fVar50 = (float)uVar12;
            fVar44 = (float)((ulong)uVar12 >> 0x20);
            auVar21._4_4_ =
                 fVar42 * (((float)((ulong)uVar11 >> 0x20) +
                           (cluster->m_framexform).m_basis.m_el[1].m_floats[2] * fVar40 +
                           (cluster->m_framexform).m_basis.m_el[1].m_floats[0] * fVar36 +
                           (cluster->m_framexform).m_basis.m_el[1].m_floats[1] * fVar37) - fVar44) +
                 fVar44;
            auVar21._0_4_ =
                 fVar42 * (((float)uVar11 +
                           (cluster->m_framexform).m_basis.m_el[0].m_floats[2] * fVar40 +
                           (cluster->m_framexform).m_basis.m_el[0].m_floats[0] * fVar36 +
                           (cluster->m_framexform).m_basis.m_el[0].m_floats[1] * fVar37) - fVar50) +
                 fVar50;
            auVar21._8_4_ =
                 (((cluster->m_framexform).m_basis.m_el[2].m_floats[2] * fVar40 +
                   (cluster->m_framexform).m_basis.m_el[2].m_floats[0] * fVar36 +
                   (cluster->m_framexform).m_basis.m_el[2].m_floats[1] * fVar37 +
                  (cluster->m_framexform).m_origin.m_floats[2]) - fVar46) * fVar42 + fVar46;
            auVar21._12_4_ = 0;
            *(undefined1 (*) [16])(pNVar18->m_x).m_floats = auVar21;
            lVar27 = lVar27 + 1;
            lVar23 = lVar23 + 0x10;
          } while (lVar27 < (cluster->m_nodes).m_size);
        }
        if (cluster->m_collide == true) {
          ppNVar17 = (cluster->m_nodes).m_data;
          local_c8.mx.m_floats = *&((*ppNVar17)->m_x).m_floats;
          bVar29 = local_c8.mx.m_floats[0];
          bVar38 = local_c8.mx.m_floats[1];
          bVar39 = local_c8.mx.m_floats[2];
          bVar35 = local_c8.mx.m_floats[3];
          local_c8.mi.m_floats = local_c8.mx.m_floats;
          if (1 < (int)uVar13) {
            uVar25 = 1;
            bVar30 = bVar29;
            bVar32 = bVar38;
            bVar33 = bVar39;
            bVar34 = bVar35;
            do {
              auVar31 = *(undefined1 (*) [16])(ppNVar17[uVar25]->m_x).m_floats;
              auVar19._4_4_ = bVar38;
              auVar19._0_4_ = bVar29;
              auVar19._8_4_ = bVar39;
              auVar19._12_4_ = bVar35;
              local_c8.mi.m_floats = (btScalar  [4])minps(auVar31,auVar19);
              auVar20._4_4_ = bVar32;
              auVar20._0_4_ = bVar30;
              auVar20._8_4_ = bVar33;
              auVar20._12_4_ = bVar34;
              local_c8.mx.m_floats = (btScalar  [4])maxps(auVar31,auVar20);
              uVar25 = uVar25 + 1;
              bVar29 = local_c8.mi.m_floats[0];
              bVar38 = local_c8.mi.m_floats[1];
              bVar39 = local_c8.mi.m_floats[2];
              bVar35 = local_c8.mi.m_floats[3];
              bVar30 = local_c8.mx.m_floats[0];
              bVar32 = local_c8.mx.m_floats[1];
              bVar33 = local_c8.mx.m_floats[2];
              bVar34 = local_c8.mx.m_floats[3];
            } while (uVar28 != uVar25);
          }
          if (cluster->m_leaf == (btDbvtNode *)0x0) {
            pbVar24 = btDbvt::insert(local_130,&local_c8,cluster);
            cluster->m_leaf = pbVar24;
          }
          else {
            fVar36 = (this->m_sst).sdt;
            uVar11 = *(undefined8 *)(cluster->m_lv).m_floats;
            local_a0.m_floats[1] = fVar36 * (float)((ulong)uVar11 >> 0x20) * 3.0;
            local_a0.m_floats[0] = fVar36 * (float)uVar11 * 3.0;
            local_a0.m_floats[2] = (cluster->m_lv).m_floats[2] * fVar36 * 3.0;
            local_a0.m_floats[3] = 0.0;
            btDbvt::update(local_130,cluster->m_leaf,&local_c8,&local_a0,(this->m_sst).radmrg);
          }
        }
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 < (this->m_clusters).m_size);
  }
  CProfileManager::Stop_Profile();
  return;
}

Assistant:

void					btSoftBody::updateClusters()
{
	BT_PROFILE("UpdateClusters");
	int i;

	for(i=0;i<m_clusters.size();++i)
	{
		btSoftBody::Cluster&	c=*m_clusters[i];
		const int				n=c.m_nodes.size();
		//const btScalar			invn=1/(btScalar)n;
		if(n)
		{
			/* Frame				*/ 
			const btScalar	eps=btScalar(0.0001);
			btMatrix3x3		m,r,s;
			m[0]=m[1]=m[2]=btVector3(0,0,0);
			m[0][0]=eps*1;
			m[1][1]=eps*2;
			m[2][2]=eps*3;
			c.m_com=clusterCom(&c);
			for(int i=0;i<c.m_nodes.size();++i)
			{
				const btVector3		a=c.m_nodes[i]->m_x-c.m_com;
				const btVector3&	b=c.m_framerefs[i];
				m[0]+=a[0]*b;m[1]+=a[1]*b;m[2]+=a[2]*b;
			}
			PolarDecompose(m,r,s);
			c.m_framexform.setOrigin(c.m_com);
			c.m_framexform.setBasis(r);		
			/* Inertia			*/ 
#if 1/* Constant	*/ 
			c.m_invwi=c.m_framexform.getBasis()*c.m_locii*c.m_framexform.getBasis().transpose();
#else
#if 0/* Sphere	*/ 
			const btScalar	rk=(2*c.m_extents.length2())/(5*c.m_imass);
			const btVector3	inertia(rk,rk,rk);
			const btVector3	iin(btFabs(inertia[0])>SIMD_EPSILON?1/inertia[0]:0,
				btFabs(inertia[1])>SIMD_EPSILON?1/inertia[1]:0,
				btFabs(inertia[2])>SIMD_EPSILON?1/inertia[2]:0);

			c.m_invwi=c.m_xform.getBasis().scaled(iin)*c.m_xform.getBasis().transpose();
#else/* Actual	*/ 		
			c.m_invwi[0]=c.m_invwi[1]=c.m_invwi[2]=btVector3(0,0,0);
			for(int i=0;i<n;++i)
			{
				const btVector3	k=c.m_nodes[i]->m_x-c.m_com;
				const btVector3		q=k*k;
				const btScalar		m=1/c.m_nodes[i]->m_im;
				c.m_invwi[0][0]	+=	m*(q[1]+q[2]);
				c.m_invwi[1][1]	+=	m*(q[0]+q[2]);
				c.m_invwi[2][2]	+=	m*(q[0]+q[1]);
				c.m_invwi[0][1]	-=	m*k[0]*k[1];
				c.m_invwi[0][2]	-=	m*k[0]*k[2];
				c.m_invwi[1][2]	-=	m*k[1]*k[2];
			}
			c.m_invwi[1][0]=c.m_invwi[0][1];
			c.m_invwi[2][0]=c.m_invwi[0][2];
			c.m_invwi[2][1]=c.m_invwi[1][2];
			c.m_invwi=c.m_invwi.inverse();
#endif
#endif
			/* Velocities			*/ 
			c.m_lv=btVector3(0,0,0);
			c.m_av=btVector3(0,0,0);
			{
				int i;

				for(i=0;i<n;++i)
				{
					const btVector3	v=c.m_nodes[i]->m_v*c.m_masses[i];
					c.m_lv	+=	v;
					c.m_av	+=	btCross(c.m_nodes[i]->m_x-c.m_com,v);
				}
			}
			c.m_lv=c.m_imass*c.m_lv*(1-c.m_ldamping);
			c.m_av=c.m_invwi*c.m_av*(1-c.m_adamping);
			c.m_vimpulses[0]	=
				c.m_vimpulses[1]	= btVector3(0,0,0);
			c.m_dimpulses[0]	=
				c.m_dimpulses[1]	= btVector3(0,0,0);
			c.m_nvimpulses		= 0;
			c.m_ndimpulses		= 0;
			/* Matching				*/ 
			if(c.m_matching>0)
			{
				for(int j=0;j<c.m_nodes.size();++j)
				{
					Node&			n=*c.m_nodes[j];
					const btVector3	x=c.m_framexform*c.m_framerefs[j];
					n.m_x=Lerp(n.m_x,x,c.m_matching);
				}
			}			
			/* Dbvt					*/ 
			if(c.m_collide)
			{
				btVector3	mi=c.m_nodes[0]->m_x;
				btVector3	mx=mi;
				for(int j=1;j<n;++j)
				{
					mi.setMin(c.m_nodes[j]->m_x);
					mx.setMax(c.m_nodes[j]->m_x);
				}			
				ATTRIBUTE_ALIGNED16(btDbvtVolume)	bounds=btDbvtVolume::FromMM(mi,mx);
				if(c.m_leaf)
					m_cdbvt.update(c.m_leaf,bounds,c.m_lv*m_sst.sdt*3,m_sst.radmrg);
				else
					c.m_leaf=m_cdbvt.insert(bounds,&c);
			}
		}
	}


}